

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

Image * Image_Function_Helper::Flip
                  (Image *__return_storage_ptr__,FlipForm4 flip,Image *in,bool horizontal,
                  bool vertical)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*flip)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
          __return_storage_ptr__->_height,horizontal,vertical);
  return __return_storage_ptr__;
}

Assistant:

Image Flip( FunctionTable::FlipForm4 flip,
                const Image & in, bool horizontal, bool vertical )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        flip( in, 0, 0, out, 0, 0, out.width(), out.height(), horizontal, vertical );

        return out;
    }